

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiMemoryLowering.cpp
# Opt level: O2

void __thiscall
wasm::MultiMemoryLowering::Replacer::visitMemoryFill(Replacer *this,MemoryFill *curr)

{
  Builder *this_00;
  char *pcVar1;
  string_view memory;
  Index index;
  Index sizeIdx;
  LocalSet *localSet;
  Expression *pEVar2;
  LocalGet *pLVar3;
  long lStackY_50;
  
  if (this->parent->checkBounds == true) {
    index = Builder::addVar((this->
                            super_WalkerPass<wasm::PostWalker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>_>
                            ).
                            super_PostWalker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>
                            .
                            super_Walker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>
                            .currFunction,(Type)(this->parent->pointerType).id);
    sizeIdx = Builder::addVar((this->
                              super_WalkerPass<wasm::PostWalker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>_>
                              ).
                              super_PostWalker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>
                              .
                              super_Walker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>
                              .currFunction,(Type)(this->parent->pointerType).id);
    memory = (curr->memory).super_IString.str;
    this_00 = &this->builder;
    localSet = Builder::makeLocalSet(this_00,index,curr->value);
    pEVar2 = getDest<wasm::MemoryFill>
                       (this,curr,(Name)memory,sizeIdx,(Expression *)localSet,(Expression *)0x0);
    curr->dest = pEVar2;
    pLVar3 = Builder::makeLocalGet(this_00,index,(Type)(this->parent->pointerType).id);
    curr->value = (Expression *)pLVar3;
    pLVar3 = Builder::makeLocalGet(this_00,sizeIdx,(Type)(this->parent->pointerType).id);
    lStackY_50 = 0x20;
  }
  else {
    pLVar3 = (LocalGet *)
             getDest<wasm::MemoryFill>
                       (this,curr,(Name)(curr->memory).super_IString.str,0xffffffff,
                        (Expression *)0x0,(Expression *)0x0);
    lStackY_50 = 0x10;
  }
  *(LocalGet **)
   ((long)&(curr->super_SpecificExpression<(wasm::Expression::Id)39>).super_Expression._id +
   lStackY_50) = pLVar3;
  pcVar1 = (this->parent->combinedMemory).super_IString.str._M_str;
  (curr->memory).super_IString.str._M_len = (this->parent->combinedMemory).super_IString.str._M_len;
  (curr->memory).super_IString.str._M_str = pcVar1;
  return;
}

Assistant:

void visitMemoryFill(MemoryFill* curr) {
      if (parent.checkBounds) {
        Index valueIdx = Builder::addVar(getFunction(), parent.pointerType);
        Index sizeIdx = Builder::addVar(getFunction(), parent.pointerType);
        curr->dest = getDest(curr,
                             curr->memory,
                             sizeIdx,
                             builder.makeLocalSet(valueIdx, curr->value));
        curr->value = builder.makeLocalGet(valueIdx, parent.pointerType);
        curr->size = builder.makeLocalGet(sizeIdx, parent.pointerType);
      } else {
        curr->dest = getDest(curr, curr->memory);
      }
      setMemory(curr);
    }